

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyzer.cpp
# Opt level: O0

void __thiscall
SemanticAnalyzerRun::onEnterDeclareStatementAstNode
          (SemanticAnalyzerRun *this,DeclareStatementAstNode *node)

{
  bool bVar1;
  element_type *peVar2;
  element_type *peVar3;
  shared_ptr<Token> *token;
  shared_ptr<Token> local_78;
  allocator<char> local_61;
  string local_60;
  undefined1 local_38 [8];
  optional<VariableDefinition> originalDeclare;
  DeclareStatementAstNode *node_local;
  SemanticAnalyzerRun *this_local;
  
  originalDeclare.super__Optional_base<VariableDefinition,_false,_false>._M_payload.
  super__Optional_payload<VariableDefinition,_true,_false,_false>.
  super__Optional_payload_base<VariableDefinition>._24_8_ = node;
  peVar2 = std::__shared_ptr_access<Scope,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Scope,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->currentScope);
  peVar3 = std::__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      (originalDeclare.super__Optional_base<VariableDefinition,_false,_false>.
                       _M_payload.super__Optional_payload<VariableDefinition,_true,_false,_false>.
                       super__Optional_payload_base<VariableDefinition>._24_8_ + 8));
  Scope::findLocally((optional<VariableDefinition> *)local_38,peVar2,&peVar3->value,false);
  bVar1 = std::operator!=(local_38);
  if (bVar1) {
    token = (shared_ptr<Token> *)
            (originalDeclare.super__Optional_base<VariableDefinition,_false,_false>._M_payload.
             super__Optional_payload<VariableDefinition,_true,_false,_false>.
             super__Optional_payload_base<VariableDefinition>._24_8_ + 8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"Duplicate identifier found within same scope.",&local_61);
    reportError(this,token,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
  }
  else {
    peVar2 = std::__shared_ptr_access<Scope,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Scope,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &this->currentScope);
    peVar3 = std::__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        (originalDeclare.super__Optional_base<VariableDefinition,_false,_false>.
                         _M_payload.super__Optional_payload<VariableDefinition,_true,_false,_false>.
                         super__Optional_payload_base<VariableDefinition>._24_8_ + 8));
    std::shared_ptr<Token>::shared_ptr
              (&local_78,
               (shared_ptr<Token> *)
               (originalDeclare.super__Optional_base<VariableDefinition,_false,_false>._M_payload.
                super__Optional_payload<VariableDefinition,_true,_false,_false>.
                super__Optional_payload_base<VariableDefinition>._24_8_ + 8));
    Scope::define(peVar2,&peVar3->value,&local_78,false);
    std::shared_ptr<Token>::~shared_ptr(&local_78);
  }
  std::optional<VariableDefinition>::~optional((optional<VariableDefinition> *)local_38);
  return;
}

Assistant:

void onEnterDeclareStatementAstNode(DeclareStatementAstNode* node) noexcept override {
    auto originalDeclare = this->currentScope->findLocally(node->identifier->value, false);
    if (originalDeclare != std::nullopt) {
      this->reportError(node->identifier, "Duplicate identifier found within same scope.");
    } else {
      // paritally define (late bound available) variable for current scope
      this->currentScope->define(node->identifier->value, node->identifier, false);
    }
  }